

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O1

bool __thiscall
ON_FixedSizePool::CreateForExperts
          (ON_FixedSizePool *this,size_t sizeof_element,size_t maximum_element_count_estimate,
          size_t minimum_block2_element_capacity)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  char *sFormat;
  int line_number;
  
  if ((this->m_sizeof_element != 0) || (this->m_first_block != (void *)0x0)) {
    sFormat = "ON_FixedSizePool::Create - called on a pool that is in use.";
    line_number = 0xbf;
LAB_00491069:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
               ,line_number,"",sFormat);
    return false;
  }
  this->m_block_element_count = 0;
  this->m_active_element_count = 0;
  this->m_total_element_count = 0;
  this->m_al_count = 0;
  this->m_sizeof_element = 0;
  this->m_al_block = (void *)0x0;
  this->m_al_element_array = (void *)0x0;
  this->m_first_block = (void *)0x0;
  this->m_al_element_stack = (void *)0x0;
  this->m_sleep_lock = (atomic_flag)0x0;
  *(undefined3 *)&this->field_0x41 = 0;
  this->m_reserved0 = 0;
  if (sizeof_element == 0) {
    sFormat = "Invalid parameter: sizeof_element <= 0.";
    line_number = 199;
    goto LAB_00491069;
  }
  sVar1 = DefaultElementCapacityFromSizeOfElement(sizeof_element);
  if (sVar1 * sizeof_element == 0) {
    sFormat = "Invalid parameter: sizeof_element is too large for a fixed size pool.";
    line_number = 0xce;
    goto LAB_00491069;
  }
  if (maximum_element_count_estimate != 0) {
    if (maximum_element_count_estimate <= sVar1 * 4) {
      sVar3 = 1;
      if (9 < maximum_element_count_estimate + 9) {
        sVar3 = (maximum_element_count_estimate + 9) / 10;
      }
      if (sVar3 <= minimum_block2_element_capacity) {
        sVar3 = minimum_block2_element_capacity;
      }
      goto LAB_004910cd;
    }
    if (sVar1 <= maximum_element_count_estimate) {
      uVar2 = maximum_element_count_estimate / (maximum_element_count_estimate / sVar1);
      maximum_element_count_estimate =
           uVar2 + ((maximum_element_count_estimate / sVar1) * uVar2 <
                   maximum_element_count_estimate);
      sVar3 = maximum_element_count_estimate;
      goto LAB_004910cd;
    }
  }
  maximum_element_count_estimate = 0;
  sVar3 = 0;
LAB_004910cd:
  this->m_sizeof_element = sizeof_element;
  if (maximum_element_count_estimate == 0) {
    maximum_element_count_estimate = sVar1;
  }
  this->m_al_count = maximum_element_count_estimate;
  if (sVar3 == 0) {
    sVar3 = sVar1;
  }
  this->m_block_element_count = sVar3;
  return true;
}

Assistant:

bool ON_FixedSizePool::CreateForExperts(
  size_t sizeof_element,
  size_t maximum_element_count_estimate,
  size_t minimum_block2_element_capacity
)
{
  if (m_sizeof_element != 0 || 0 != m_first_block)
  {
    ON_ERROR("ON_FixedSizePool::Create - called on a pool that is in use.");
    return false;
  }

  memset(this, 0, sizeof(*this));

  if (sizeof_element <= 0)
  {
    ON_ERROR("Invalid parameter: sizeof_element <= 0.");
    return false;
  }

  const size_t default_block_capacity = ON_FixedSizePool::DefaultElementCapacityFromSizeOfElement(sizeof_element);
  if (default_block_capacity <= 0 || default_block_capacity* sizeof_element <= 0)
  {
    ON_ERROR("Invalid parameter: sizeof_element is too large for a fixed size pool.");
    return false;
  }

  if (maximum_element_count_estimate < 0)
  {
    ON_ERROR("Invalid parameter: block1_element_count < 0.");
    return false;
  }

  if (0 == maximum_element_count_estimate)
    minimum_block2_element_capacity = 0;
  else if (minimum_block2_element_capacity < 0)
  {
    ON_ERROR("Invalid parameter: minimum_block2_element_capacity < 0.");
    return false;
  }


  size_t block1_capacity = 0; // 1st block will have room for m_al_count elements.
  size_t block2_capacity = 0; // 2nd and subsequent blocks will have room m_block_element_count elements.

  if (maximum_element_count_estimate > 0)
  {
    if (maximum_element_count_estimate <= 4 * default_block_capacity)
    {
      // We should be able to reliably allocate a contiguous memory space
      // that will hold maximum_element_count_estimate elements.
      block1_capacity = maximum_element_count_estimate;

      // The caller claims that maximum_element_count_estimate is a tight upper bound
      // on the number of elements to be allocated.
      // If they underestimated, keep subsequent blocks small assuming that they
      // underestimated by only a little bit.
      block2_capacity = (block1_capacity + 9) / 10;
      if (block2_capacity <= 0)
        block2_capacity = 1;
      if (block2_capacity < minimum_block2_element_capacity)
        block2_capacity = minimum_block2_element_capacity;
    }
    else
    {
      // The value maximum_element_count_estimate is too big for 
      // a reasonably sized chuck of contiguous memory space.
      //
      // Find a way to allocate maximum_element_count_estimate elements from
      // multiple blocks and not waste a bunch of memory when 
      // maximum_element_count_estimate is tight upper bound on the 
      // number of element that will actually be allocated.
      //
      // minimum_block2_element_capacity is intentionally being ignored
      // in this case.
      size_t n = maximum_element_count_estimate / default_block_capacity;
      if (n > 0)
      {
        // We will use n blocks of block1_capacity elements to deliver
        // maximum_element_count_estimate elements. These
        // blocks will be reasonably sized and easy to allocate.
        block1_capacity = maximum_element_count_estimate / n;
        if (n * block1_capacity < maximum_element_count_estimate)
          ++block1_capacity;
        block2_capacity = block1_capacity;
      }
    }
  }

  //////////////////////////////
  // Initialize this pool

  m_sizeof_element = sizeof_element;

  // 1st block will have room for m_al_count elements.
  m_al_count = block1_capacity > 0 ? block1_capacity : default_block_capacity; 

  // 2nd and subsequent blocks will have room m_block_element_count elements.
  m_block_element_count = block2_capacity > 0 ? block2_capacity : default_block_capacity; 

  return true;
}